

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialJPDPValuePair.cpp
# Opt level: O2

void __thiscall
PartialJPDPValuePair::PartialJPDPValuePair(PartialJPDPValuePair *this,PartialJPDPValuePair *o)

{
  int iVar1;
  undefined4 extraout_var;
  undefined1 auVar2 [64];
  shared_ptr<PartialJointPolicyDiscretePure> sStack_38;
  
  (this->super_PartialJointPolicyValuePair)._m_val = (o->super_PartialJointPolicyValuePair)._m_val;
  auVar2 = ZEXT864(0) << 0x20;
  (this->super_PartialJointPolicyValuePair).super_PartialPolicyPoolItemInterface.
  _vptr_PartialPolicyPoolItemInterface = (_func_int **)&PTR__PartialJPDPValuePair_005e5280;
  (this->_m_jpol).px = (element_type *)SUB168(auVar2._0_16_,0);
  (this->_m_jpol).pn = (shared_count)SUB168(auVar2._0_16_,8);
  (this->_m_bgip_solver).px = (element_type *)SUB168(auVar2._16_16_,0);
  (this->_m_bgip_solver).pn = (shared_count)SUB168(auVar2._16_16_,8);
  (this->_m_bgcg_solver).px = (element_type *)SUB168(auVar2._32_16_,0);
  (this->_m_bgcg_solver).pn = (shared_count)SUB168(auVar2._32_16_,8);
  (this->_m_bgip_solver_T).px = (element_type *)SUB168(auVar2._48_16_,0);
  (this->_m_bgip_solver_T).pn = (shared_count)SUB168(auVar2._48_16_,8);
  (this->_m_bgip_solver).px = (element_type *)SUB168(auVar2._0_16_,0);
  (this->_m_bgip_solver).pn = (shared_count)SUB168(auVar2._0_16_,8);
  (this->_m_bgcg_solver).px = (element_type *)SUB168(auVar2._16_16_,0);
  (this->_m_bgcg_solver).pn = (shared_count)SUB168(auVar2._16_16_,8);
  (this->_m_bgip_solver_T).px = (element_type *)SUB168(auVar2._32_16_,0);
  (this->_m_bgip_solver_T).pn = (shared_count)SUB168(auVar2._32_16_,8);
  (this->_m_bgip_solver_TC).px = (element_type *)SUB168(auVar2._48_16_,0);
  (this->_m_bgip_solver_TC).pn = (shared_count)SUB168(auVar2._48_16_,8);
  iVar1 = (*(((o->_m_jpol).px)->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
            super_JointPolicy._vptr_JointPolicy[5])();
  boost::shared_ptr<PartialJointPolicyDiscretePure>::shared_ptr<PartialJointPolicyDiscretePure>
            (&sStack_38,(PartialJointPolicyDiscretePure *)CONCAT44(extraout_var,iVar1));
  boost::shared_ptr<PartialJointPolicyDiscretePure>::operator=(&this->_m_jpol,&sStack_38);
  boost::detail::shared_count::~shared_count(&sStack_38.pn);
  boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::operator=
            (&this->_m_bgip_solver,&o->_m_bgip_solver);
  boost::shared_ptr<BGCG_Solver>::operator=(&this->_m_bgcg_solver,&o->_m_bgcg_solver);
  boost::shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector>_>::operator=
            (&this->_m_bgip_solver_T,&o->_m_bgip_solver_T);
  boost::shared_ptr<BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG>_>::
  operator=(&this->_m_bgip_solver_TC,&o->_m_bgip_solver_TC);
  return;
}

Assistant:

PartialJPDPValuePair::PartialJPDPValuePair(const PartialJPDPValuePair& o) :
    PartialJointPolicyValuePair(o)
{
    _m_jpol = PJPDP_sharedPtr(o._m_jpol->Clone());
    _m_bgip_solver = o._m_bgip_solver;
    _m_bgcg_solver = o._m_bgcg_solver;    
    _m_bgip_solver_T = o._m_bgip_solver_T;
    _m_bgip_solver_TC = o._m_bgip_solver_TC;    
}